

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adlmidi_midiplay.cpp
# Opt level: O0

void __thiscall MIDIplay::updateVibrato(MIDIplay *this,double amount)

{
  double dVar1;
  bool bVar2;
  size_type sVar3;
  reference pMVar4;
  size_t b;
  size_t a;
  double amount_local;
  MIDIplay *this_local;
  
  b = 0;
  sVar3 = std::vector<MIDIplay::MIDIchannel,_std::allocator<MIDIplay::MIDIchannel>_>::size
                    (&this->m_midiChannels);
  do {
    if (sVar3 <= b) {
      return;
    }
    pMVar4 = std::vector<MIDIplay::MIDIchannel,_std::allocator<MIDIplay::MIDIchannel>_>::operator[]
                       (&this->m_midiChannels,b);
    bVar2 = MIDIchannel::hasVibrato(pMVar4);
    if (bVar2) {
      pMVar4 = std::vector<MIDIplay::MIDIchannel,_std::allocator<MIDIplay::MIDIchannel>_>::
               operator[](&this->m_midiChannels,b);
      bVar2 = pl_list<MIDIplay::MIDIchannel::NoteInfo>::empty(&pMVar4->activenotes);
      if (bVar2) goto LAB_0016f892;
      noteUpdateAll(this,b & 0xffff,8);
      pMVar4 = std::vector<MIDIplay::MIDIchannel,_std::allocator<MIDIplay::MIDIchannel>_>::
               operator[](&this->m_midiChannels,b);
      dVar1 = pMVar4->vibspeed;
      pMVar4 = std::vector<MIDIplay::MIDIchannel,_std::allocator<MIDIplay::MIDIchannel>_>::
               operator[](&this->m_midiChannels,b);
      pMVar4->vibpos = amount * dVar1 + pMVar4->vibpos;
    }
    else {
LAB_0016f892:
      pMVar4 = std::vector<MIDIplay::MIDIchannel,_std::allocator<MIDIplay::MIDIchannel>_>::
               operator[](&this->m_midiChannels,b);
      pMVar4->vibpos = 0.0;
    }
    b = b + 1;
  } while( true );
}

Assistant:

void MIDIplay::updateVibrato(double amount)
{
    for(size_t a = 0, b = m_midiChannels.size(); a < b; ++a)
    {
        if(m_midiChannels[a].hasVibrato() && !m_midiChannels[a].activenotes.empty())
        {
            noteUpdateAll(static_cast<uint16_t>(a), Upd_Pitch);
            m_midiChannels[a].vibpos += amount * m_midiChannels[a].vibspeed;
        }
        else
            m_midiChannels[a].vibpos = 0.0;
    }
}